

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

char * str_find_nocase(char *haystack,char *needle)

{
  char cVar1;
  long lVar2;
  __int32_t **pp_Var3;
  char cVar4;
  char *pcVar5;
  long lVar6;
  bool bVar7;
  
  do {
    pcVar5 = haystack;
    cVar4 = *pcVar5;
    if (cVar4 == '\0') {
      return (char *)0x0;
    }
    lVar2 = 1;
    do {
      lVar6 = lVar2;
      cVar1 = needle[lVar6 + -1];
      if ((long)cVar1 == 0) {
        return pcVar5;
      }
      pp_Var3 = __ctype_tolower_loc();
      if ((*pp_Var3)[cVar4] != (*pp_Var3)[cVar1]) {
        bVar7 = false;
        goto LAB_001d1027;
      }
      cVar4 = pcVar5[lVar6];
      lVar2 = lVar6 + 1;
    } while (cVar4 != '\0');
    bVar7 = needle[lVar6] == '\0';
LAB_001d1027:
    haystack = pcVar5 + 1;
    if (bVar7) {
      return pcVar5;
    }
  } while( true );
}

Assistant:

const char *str_find_nocase(const char *haystack, const char *needle)
{
	while(*haystack) /* native implementation */
	{
		const char *a = haystack;
		const char *b = needle;
		while(*a && *b && tolower(*a) == tolower(*b))
		{
			a++;
			b++;
		}
		if(!(*b))
			return haystack;
		haystack++;
	}

	return 0;
}